

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shapes.h
# Opt level: O3

optional<pbrt::ShapeSample> * __thiscall
pbrt::ShapeHandle::Sample
          (optional<pbrt::ShapeSample> *__return_storage_ptr__,ShapeHandle *this,
          ShapeSampleContext *ctx,Point2f u)

{
  ulong uVar1;
  uint uVar2;
  Sphere *this_00;
  Curve *this_01;
  
  uVar1 = (this->
          super_TaggedPointer<pbrt::Sphere,_pbrt::Cylinder,_pbrt::Disk,_pbrt::Triangle,_pbrt::BilinearPatch,_pbrt::Curve>
          ).bits;
  uVar2 = (uint)(ushort)(uVar1 >> 0x30);
  if (uVar1 >> 0x32 == 0) {
    this_00 = (Sphere *)(uVar1 & 0xffffffffffff);
    if (uVar1 >> 0x31 == 0) {
      Sphere::Sample(__return_storage_ptr__,this_00,ctx,u);
    }
    else if (uVar2 == 2) {
      Cylinder::Sample(__return_storage_ptr__,(Cylinder *)this_00,ctx,u);
    }
    else {
      Disk::Sample(__return_storage_ptr__,(Disk *)this_00,ctx,u);
    }
  }
  else {
    uVar2 = uVar2 - 3;
    this_01 = (Curve *)(uVar1 & 0xffffffffffff);
    if (uVar2 < 2) {
      Triangle::Sample(__return_storage_ptr__,(Triangle *)this_01,ctx,u);
    }
    else if (uVar2 == 2) {
      BilinearPatch::Sample(__return_storage_ptr__,(BilinearPatch *)this_01,ctx,u);
    }
    else {
      Curve::Sample(__return_storage_ptr__,this_01,ctx,u);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

inline pstd::optional<ShapeSample> ShapeHandle::Sample(const ShapeSampleContext &ctx,
                                                       Point2f u) const {
    auto sample = [&](auto ptr) { return ptr->Sample(ctx, u); };
    return Dispatch(sample);
}